

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O3

void wolffstep<trng::yarn3s>(yarn3s *R,lattice *s,double T)

{
  int *piVar1;
  pointer piVar2;
  coord cVar3;
  int iVar4;
  int iVar5;
  coord cVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ret_t rVar13;
  queue<coord,_std::deque<coord,_std::allocator<coord>_>_> buffer;
  coord local_98;
  double local_90;
  _Deque_base<coord,_std::allocator<coord>_> local_88;
  double local_30;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (coord *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (coord *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (coord *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (coord *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_90 = T;
  std::_Deque_base<coord,_std::allocator<coord>_>::_M_initialize_map(&local_88,0);
  local_30 = exp(-2.0 / local_90);
  local_90 = (double)s->L;
  rVar13 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R);
  local_98.x = (int)(rVar13 * 4.656658559636768e-10 * local_90);
  rVar13 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R);
  cVar6 = local_98;
  iVar4 = (int)(rVar13 * 4.656658559636768e-10 * local_90);
  local_98.y = iVar4;
  iVar7 = s->L;
  uVar10 = local_98.x;
  if (local_98.x < 0) {
    uVar8 = (ulong)cVar6 & 0xffffffff;
    do {
      uVar10 = (int)uVar8 + iVar7;
      uVar8 = (ulong)uVar10;
    } while ((int)uVar10 < 0);
  }
  local_90 = 1.0 - local_30;
  iVar11 = uVar10 + iVar7;
  do {
    iVar11 = iVar11 - iVar7;
  } while (iVar7 <= iVar11);
  iVar5 = iVar4;
  if (iVar4 < 0) {
    iVar12 = iVar7 + iVar4;
    iVar5 = 0;
    if (0 < iVar12) {
      iVar5 = iVar12;
    }
    iVar5 = (((uint)(((iVar12 >> 0x1f) - iVar12) + iVar5) / (iVar7 + (uint)(iVar7 == 0)) -
             (iVar12 >> 0x1f)) + 1) * iVar7 + iVar4;
  }
  iVar5 = iVar5 + iVar7;
  iVar11 = iVar7 * iVar5 + iVar11;
  do {
    iVar11 = iVar11 - iVar7 * iVar7;
    iVar5 = iVar5 - iVar7;
  } while (iVar7 <= iVar5);
  piVar2 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar8 = (ulong)cVar6 & 0xffffffff;
  uVar10 = local_98.x;
  while ((int)uVar10 < 0) {
    uVar10 = (int)uVar8 + iVar7;
    uVar8 = (ulong)uVar10;
  }
  iVar11 = piVar2[iVar11];
  iVar5 = uVar10 + iVar7;
  do {
    iVar5 = iVar5 - iVar7;
  } while (iVar7 <= iVar5);
  if (iVar4 < 0) {
    iVar9 = iVar7 + iVar4;
    iVar12 = 0;
    if (0 < iVar9) {
      iVar12 = iVar9;
    }
    iVar4 = (((uint)(((iVar9 >> 0x1f) - iVar9) + iVar12) / (iVar7 + (uint)(iVar7 == 0)) -
             (iVar9 >> 0x1f)) + 1) * iVar7 + iVar4;
  }
  iVar4 = iVar4 + iVar7;
  iVar5 = iVar7 * iVar4 + iVar5;
  do {
    iVar5 = iVar5 - iVar7 * iVar7;
    iVar4 = iVar4 - iVar7;
  } while (iVar7 <= iVar4);
  piVar1 = piVar2 + iVar5;
  *piVar1 = -*piVar1;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
              ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      cVar6 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        local_98 = cVar6;
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        cVar6 = (coord)((ulong)local_98 & 0xffffffff);
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        local_98 = cVar6;
      }
      cVar3 = local_98;
      iVar4 = cVar6.x + -1;
      local_98.x = iVar4;
      iVar7 = s->L;
      for (; iVar4 < 0; iVar4 = iVar4 + iVar7) {
      }
      do {
        iVar5 = iVar4;
        iVar4 = iVar5 - iVar7;
      } while (iVar7 <= iVar5);
      iVar4 = local_98.y;
      if ((long)cVar3 < 0) {
        iVar12 = iVar7 + local_98.y;
        iVar4 = 0;
        if (0 < iVar12) {
          iVar4 = iVar12;
        }
        iVar4 = (((uint)(((iVar12 >> 0x1f) - iVar12) + iVar4) / (iVar7 + (uint)(iVar7 == 0)) -
                 (iVar12 >> 0x1f)) + 1) * iVar7 + local_98.y;
      }
      iVar4 = iVar4 + iVar7;
      iVar5 = iVar7 * iVar4 + iVar5;
      do {
        iVar5 = iVar5 - iVar7 * iVar7;
        iVar4 = iVar4 - iVar7;
      } while (iVar7 <= iVar4);
      if (((s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5] == iVar11) &&
         (rVar13 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R),
         rVar13 * 4.656658559636768e-10 < local_90)) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
                    ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        iVar7 = s->L;
        uVar10 = local_98.x;
        uVar8 = (ulong)local_98 & 0xffffffff;
        while ((int)uVar10 < 0) {
          uVar10 = (int)uVar8 + iVar7;
          uVar8 = (ulong)uVar10;
        }
        iVar4 = local_98.y;
        do {
          iVar5 = (int)uVar8;
          uVar8 = (ulong)(uint)(iVar5 - iVar7);
        } while (iVar7 <= iVar5);
        if ((long)local_98 < 0) {
          iVar9 = iVar7 + iVar4;
          iVar12 = 0;
          if (0 < iVar9) {
            iVar12 = iVar9;
          }
          iVar4 = (((uint)(((iVar9 >> 0x1f) - iVar9) + iVar12) / (iVar7 + (uint)(iVar7 == 0)) -
                   (iVar9 >> 0x1f)) + 1) * iVar7 + iVar4;
        }
        iVar4 = iVar4 + iVar7;
        iVar5 = iVar7 * iVar4 + iVar5;
        do {
          iVar5 = iVar5 - iVar7 * iVar7;
          iVar4 = iVar4 - iVar7;
        } while (iVar7 <= iVar4);
        piVar1 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        *piVar1 = -*piVar1;
      }
      cVar6 = local_98;
      iVar7 = local_98.x + 2;
      local_98.x = iVar7;
      iVar4 = s->L;
      for (; iVar7 < 0; iVar7 = iVar7 + iVar4) {
      }
      do {
        iVar5 = iVar7;
        iVar7 = iVar5 - iVar4;
      } while (iVar4 <= iVar5);
      iVar7 = local_98.y;
      if ((long)cVar6 < 0) {
        iVar12 = iVar4 + local_98.y;
        iVar7 = 0;
        if (0 < iVar12) {
          iVar7 = iVar12;
        }
        iVar7 = (((uint)(((iVar12 >> 0x1f) - iVar12) + iVar7) / (iVar4 + (uint)(iVar4 == 0)) -
                 (iVar12 >> 0x1f)) + 1) * iVar4 + local_98.y;
      }
      iVar7 = iVar7 + iVar4;
      iVar5 = iVar4 * iVar7 + iVar5;
      do {
        iVar5 = iVar5 - iVar4 * iVar4;
        iVar7 = iVar7 - iVar4;
      } while (iVar4 <= iVar7);
      if (((s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5] == iVar11) &&
         (rVar13 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R),
         rVar13 * 4.656658559636768e-10 < local_90)) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
                    ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        iVar7 = s->L;
        uVar10 = local_98.x;
        uVar8 = (ulong)local_98 & 0xffffffff;
        while ((int)uVar10 < 0) {
          uVar10 = (int)uVar8 + iVar7;
          uVar8 = (ulong)uVar10;
        }
        iVar4 = local_98.y;
        do {
          iVar5 = (int)uVar8;
          uVar8 = (ulong)(uint)(iVar5 - iVar7);
        } while (iVar7 <= iVar5);
        if ((long)local_98 < 0) {
          iVar9 = iVar7 + iVar4;
          iVar12 = 0;
          if (0 < iVar9) {
            iVar12 = iVar9;
          }
          iVar4 = (((uint)(((iVar9 >> 0x1f) - iVar9) + iVar12) / (iVar7 + (uint)(iVar7 == 0)) -
                   (iVar9 >> 0x1f)) + 1) * iVar7 + iVar4;
        }
        iVar4 = iVar4 + iVar7;
        iVar5 = iVar7 * iVar4 + iVar5;
        do {
          iVar5 = iVar5 - iVar7 * iVar7;
          iVar4 = iVar4 - iVar7;
        } while (iVar7 <= iVar4);
        piVar1 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        *piVar1 = -*piVar1;
      }
      iVar7 = local_98.y;
      local_98.x = local_98.x + -1;
      local_98.y = iVar7 + -1;
      iVar7 = s->L;
      for (iVar4 = local_98.x; iVar4 < 0; iVar4 = iVar4 + iVar7) {
      }
      do {
        iVar5 = iVar4;
        iVar4 = iVar5 - iVar7;
      } while (iVar7 <= iVar5);
      iVar4 = local_98.y;
      if (local_98.y < 0) {
        iVar4 = iVar7 + local_98.y;
        iVar12 = 0;
        if (0 < iVar4) {
          iVar12 = iVar4;
        }
        iVar4 = (((uint)(((iVar4 >> 0x1f) - iVar4) + iVar12) / (iVar7 + (uint)(iVar7 == 0)) -
                 (iVar4 >> 0x1f)) + 1) * iVar7 + local_98.y;
      }
      iVar4 = iVar4 + iVar7;
      iVar5 = iVar7 * iVar4 + iVar5;
      do {
        iVar5 = iVar5 - iVar7 * iVar7;
        iVar4 = iVar4 - iVar7;
      } while (iVar7 <= iVar4);
      if (((s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5] == iVar11) &&
         (rVar13 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R),
         rVar13 * 4.656658559636768e-10 < local_90)) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
                    ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        iVar7 = s->L;
        uVar10 = local_98.x;
        uVar8 = (ulong)local_98 & 0xffffffff;
        while ((int)uVar10 < 0) {
          uVar10 = (int)uVar8 + iVar7;
          uVar8 = (ulong)uVar10;
        }
        iVar4 = local_98.y;
        do {
          iVar5 = (int)uVar8;
          uVar8 = (ulong)(uint)(iVar5 - iVar7);
        } while (iVar7 <= iVar5);
        if ((long)local_98 < 0) {
          iVar9 = iVar7 + iVar4;
          iVar12 = 0;
          if (0 < iVar9) {
            iVar12 = iVar9;
          }
          iVar4 = (((uint)(((iVar9 >> 0x1f) - iVar9) + iVar12) / (iVar7 + (uint)(iVar7 == 0)) -
                   (iVar9 >> 0x1f)) + 1) * iVar7 + iVar4;
        }
        iVar4 = iVar4 + iVar7;
        iVar5 = iVar7 * iVar4 + iVar5;
        do {
          iVar5 = iVar5 - iVar7 * iVar7;
          iVar4 = iVar4 - iVar7;
        } while (iVar7 <= iVar4);
        piVar1 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        *piVar1 = -*piVar1;
      }
      cVar6 = local_98;
      iVar7 = local_98.y + 2;
      local_98.y = iVar7;
      iVar4 = s->L;
      uVar8 = (ulong)cVar6 & 0xffffffff;
      uVar10 = local_98.x;
      while ((int)uVar10 < 0) {
        uVar10 = (int)uVar8 + iVar4;
        uVar8 = (ulong)uVar10;
      }
      do {
        iVar5 = (int)uVar8;
        uVar8 = (ulong)(uint)(iVar5 - iVar4);
      } while (iVar4 <= iVar5);
      if (iVar7 < 0) {
        iVar9 = iVar4 + iVar7;
        iVar12 = 0;
        if (0 < iVar9) {
          iVar12 = iVar9;
        }
        iVar7 = (((uint)(((iVar9 >> 0x1f) - iVar9) + iVar12) / (iVar4 + (uint)(iVar4 == 0)) -
                 (iVar9 >> 0x1f)) + 1) * iVar4 + iVar7;
      }
      iVar7 = iVar7 + iVar4;
      iVar5 = iVar4 * iVar7 + iVar5;
      do {
        iVar5 = iVar5 - iVar4 * iVar4;
        iVar7 = iVar7 - iVar4;
      } while (iVar4 <= iVar7);
      if (((s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5] == iVar11) &&
         (rVar13 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn3s>::addin(R),
         rVar13 * 4.656658559636768e-10 < local_90)) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<coord,std::allocator<coord>>::_M_push_back_aux<coord_const&>
                    ((deque<coord,std::allocator<coord>> *)&local_88,&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        iVar7 = s->L;
        uVar10 = local_98.x;
        uVar8 = (ulong)local_98 & 0xffffffff;
        while ((int)uVar10 < 0) {
          uVar10 = (int)uVar8 + iVar7;
          uVar8 = (ulong)uVar10;
        }
        iVar4 = local_98.y;
        do {
          iVar5 = (int)uVar8;
          uVar8 = (ulong)(uint)(iVar5 - iVar7);
        } while (iVar7 <= iVar5);
        if ((long)local_98 < 0) {
          iVar9 = iVar7 + iVar4;
          iVar12 = 0;
          if (0 < iVar9) {
            iVar12 = iVar9;
          }
          iVar4 = (((uint)(((iVar9 >> 0x1f) - iVar9) + iVar12) / (iVar7 + (uint)(iVar7 == 0)) -
                   (iVar9 >> 0x1f)) + 1) * iVar7 + iVar4;
        }
        iVar4 = iVar4 + iVar7;
        iVar5 = iVar7 * iVar4 + iVar5;
        do {
          iVar5 = iVar5 - iVar7 * iVar7;
          iVar4 = iVar4 - iVar7;
        } while (iVar7 <= iVar4);
        piVar1 = (s->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        *piVar1 = -*piVar1;
      }
      local_98.y = local_98.y + -1;
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<coord,_std::allocator<coord>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void wolffstep(RNG_type &R, lattice &s, double T) {
  std::queue<coord> buffer;
  const double padd = 1.0 - std::exp(-2.0 / T);

  trng::uniform_int_dist U(0, s.size());
  trng::bernoulli_dist<bool> B(padd, true, false);
  coord r;

  r.x = U(R);
  r.y = U(R);
  const int oldspin{s.get(r)};
  s.flipp(r);
  buffer.push(r);
  while (!buffer.empty()) {
    r = buffer.front();
    buffer.pop();
    --r.x;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    ++r.x;
    ++r.x;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    --r.x;
    --r.y;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    ++r.y;
    ++r.y;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    --r.y;
  }
}